

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlBufDumpElementDecl(xmlOutputBufferPtr buf,xmlElementPtr elem)

{
  xmlElementTypeVal xVar1;
  xmlElementContentType xVar2;
  xmlElementContentPtr cur;
  int iVar3;
  char *pcVar4;
  xmlElementContentPtr cur_00;
  _xmlElementContent *p_Var5;
  
  xmlOutputBufferWrite(buf,10,"<!ELEMENT ");
  if (elem->prefix != (xmlChar *)0x0) {
    xmlOutputBufferWriteString(buf,(char *)elem->prefix);
    xmlOutputBufferWrite(buf,1,":");
  }
  xmlOutputBufferWriteString(buf,(char *)elem->name);
  xmlOutputBufferWrite(buf,1," ");
  xVar1 = elem->etype;
  if (xVar1 - XML_ELEMENT_TYPE_MIXED < 2) {
    cur = elem->content;
    if (cur != (xmlElementContentPtr)0x0) {
      xmlOutputBufferWrite(buf,1,"(");
      cur_00 = cur;
      do {
        if (cur_00 == (xmlElementContentPtr)0x0) goto LAB_00170efc;
        xVar2 = cur_00->type;
        if (xVar2 - XML_ELEMENT_CONTENT_SEQ < 2) {
          if (((cur_00 != cur) && (cur_00->parent != (_xmlElementContent *)0x0)) &&
             ((xVar2 != cur_00->parent->type || (cur_00->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
            xmlOutputBufferWrite(buf,1,"(");
          }
          p_Var5 = cur_00->c1;
        }
        else {
          if (xVar2 == XML_ELEMENT_CONTENT_PCDATA) {
            xmlOutputBufferWrite(buf,7,"#PCDATA");
          }
          else if (xVar2 == XML_ELEMENT_CONTENT_ELEMENT) {
            if (cur_00->prefix != (xmlChar *)0x0) {
              xmlOutputBufferWriteString(buf,(char *)cur_00->prefix);
              xmlOutputBufferWrite(buf,1,":");
            }
            xmlOutputBufferWriteString(buf,(char *)cur_00->name);
          }
          do {
            p_Var5 = cur_00;
            if (cur_00 == cur) goto LAB_00170ebe;
            p_Var5 = cur_00->parent;
            if (p_Var5 == (_xmlElementContent *)0x0) {
              iVar3 = 1;
              p_Var5 = cur_00;
            }
            else {
              if ((cur_00->type - XML_ELEMENT_CONTENT_SEQ < 2) &&
                 ((cur_00->type != p_Var5->type || (cur_00->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
                xmlOutputBufferWrite(buf,1,")");
              }
              xmlBufDumpElementOccur(buf,cur_00);
              iVar3 = 0;
              if (cur_00 == p_Var5->c1) {
                pcVar4 = " , ";
                if (p_Var5->type == XML_ELEMENT_CONTENT_SEQ) {
LAB_00170e9b:
                  xmlOutputBufferWrite(buf,3,pcVar4);
                }
                else if (p_Var5->type == XML_ELEMENT_CONTENT_OR) {
                  pcVar4 = " | ";
                  goto LAB_00170e9b;
                }
                iVar3 = 6;
                p_Var5 = p_Var5->c2;
              }
            }
            cur_00 = p_Var5;
          } while (iVar3 == 0);
          if (iVar3 != 6) goto LAB_00170efc;
        }
LAB_00170ebe:
        cur_00 = p_Var5;
      } while (p_Var5 != cur);
      xmlOutputBufferWrite(buf,1,")");
      xmlBufDumpElementOccur(buf,cur);
    }
  }
  else {
    if (xVar1 == XML_ELEMENT_TYPE_ANY) {
      pcVar4 = ", ANY";
      iVar3 = 3;
    }
    else {
      if (xVar1 != XML_ELEMENT_TYPE_EMPTY) goto LAB_00170efc;
      pcVar4 = ", EMPTY";
      iVar3 = 5;
    }
    xmlOutputBufferWrite(buf,iVar3,pcVar4 + 2);
  }
LAB_00170efc:
  xmlOutputBufferWrite(buf,2,">\n");
  return;
}

Assistant:

static void
xmlBufDumpElementDecl(xmlOutputBufferPtr buf, xmlElementPtr elem) {
    xmlOutputBufferWrite(buf, 10, "<!ELEMENT ");
    if (elem->prefix != NULL) {
        xmlOutputBufferWriteString(buf, (const char *) elem->prefix);
        xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *) elem->name);
    xmlOutputBufferWrite(buf, 1, " ");

    switch (elem->etype) {
	case XML_ELEMENT_TYPE_EMPTY:
	    xmlOutputBufferWrite(buf, 5, "EMPTY");
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    xmlOutputBufferWrite(buf, 3, "ANY");
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	case XML_ELEMENT_TYPE_ELEMENT:
	    xmlBufDumpElementContent(buf, elem->content);
	    break;
        default:
            /* assert(0); */
            break;
    }

    xmlOutputBufferWrite(buf, 2, ">\n");
}